

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender.cpp
# Opt level: O3

void __thiscall
duckdb::BaseAppender::AppendValueInternal<unsigned_long,duckdb::dtime_tz_t>
          (BaseAppender *this,Vector *col,unsigned_long input)

{
  NotImplementedException *this_00;
  size_type __dnew;
  size_type local_48;
  string local_40;
  
  this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  local_48 = 0x26;
  local_40._M_dataplus._M_p =
       (pointer)::std::__cxx11::string::_M_create((ulong *)&local_40,(ulong)&local_48);
  local_40.field_2._M_allocated_capacity = local_48;
  builtin_strncpy(local_40._M_dataplus._M_p,"Unimplemented type for cast (%s -> %s)",0x26);
  local_40._M_string_length = local_48;
  local_40._M_dataplus._M_p[local_48] = '\0';
  NotImplementedException::NotImplementedException<duckdb::PhysicalType,duckdb::PhysicalType>
            (this_00,&local_40,UINT64,INVALID);
  __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void BaseAppender::Destructor() {
	if (Exception::UncaughtException()) {
		return;
	}
	// Flush any remaining chunks, if we are not cleaning up as part of an exception stack unwind wrapped in a
	// try/catch. Close() can throw if the table was dropped in the meantime.
	try {
		Close();
	} catch (...) { // NOLINT
	}
}